

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.cpp
# Opt level: O1

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  GCObject *pGVar3;
  GCObject **__s;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  if (L->l_G->gcstate != '\x02') {
    if (newsize < -1) {
      __s = (GCObject **)luaM_toobig(L);
    }
    else {
      __s = (GCObject **)luaM_realloc_(L,(void *)0x0,0,(long)newsize * 8);
    }
    pgVar1 = L->l_G;
    if (0 < newsize) {
      memset(__s,0,(ulong)(uint)newsize << 3);
    }
    iVar5 = (pgVar1->strt).size;
    if (0 < iVar5) {
      lVar4 = 0;
      do {
        pGVar3 = (pgVar1->strt).hash[lVar4];
        while (pGVar3 != (GCObject *)0x0) {
          pGVar2 = (pGVar3->gch).next;
          uVar6 = (long)*(int *)((long)pGVar3 + 0xc) & (long)newsize - 1U;
          (pGVar3->gch).next = __s[uVar6];
          __s[uVar6] = pGVar3;
          pGVar3 = pGVar2;
        }
        lVar4 = lVar4 + 1;
        iVar5 = (pgVar1->strt).size;
      } while (lVar4 < iVar5);
    }
    luaM_realloc_(L,(pgVar1->strt).hash,(long)iVar5 << 3,0);
    (pgVar1->strt).size = newsize;
    (pgVar1->strt).hash = __s;
  }
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  GCObject **newhash;
  stringtable *tb;
  int i;
  if (G(L)->gcstate == GCSsweepstring)
    return;  /* cannot resize during GC traverse */
  newhash = luaM_newvector(L, newsize, GCObject *);
  tb = &G(L)->strt;
  for (i=0; i<newsize; i++) newhash[i] = NULL;
  /* rehash */
  for (i=0; i<tb->size; i++) {
    GCObject *p = tb->hash[i];
    while (p) {  /* for each node in the list */
      GCObject *next = p->gch.next;  /* save next */
      unsigned int h = gco2ts(p)->hash;
      int h1 = lmod(h, newsize);  /* new position */
      lua_assert(cast_int(h%newsize) == lmod(h, newsize));
      p->gch.next = newhash[h1];  /* chain it */
      newhash[h1] = p;
      p = next;
    }
  }
  luaM_freearray(L, tb->hash, tb->size, TString *);
  tb->size = newsize;
  tb->hash = newhash;
}